

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O1

void __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::reset
          (KalmanFilterBase<4U,_3U,_0U> *this)

{
  (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase[3]
  )();
  (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase[5]
  )(this);
  (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase[7]
  )(this);
  (this->a_).k_ = 0;
  (this->a_).isSet_ = false;
  (this->c_).k_ = 0;
  (this->c_).isSet_ = false;
  (this->q_).k_ = 0;
  (this->q_).isSet_ = false;
  (this->r_).k_ = 0;
  (this->r_).isSet_ = false;
  (this->p_).k_ = 0;
  (this->p_).isSet_ = false;
  return;
}

Assistant:

void KalmanFilterBase<n,m,p>::reset()
{
    ZeroDelayObserver<n,m,p>::reset();

    a_.reset();
    c_.reset();
    a_.reset();
    c_.reset();
    q_.reset();
    r_.reset();
    p_.reset();
}